

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O3

uint32_t lua_hash(char *str,uint32_t len)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint32_t h;
  
  if (len < 4) {
    if (len == 0) {
      return 0;
    }
    uVar2 = (uint)*str;
    uVar3 = (uint)str[len >> 1];
    uVar1 = ((int)str[(ulong)len - 1] ^ len ^ uVar3) - (uVar3 << 0xe | uVar3 >> 0x12);
  }
  else {
    uVar2 = *(uint *)str;
    uVar3 = *(uint *)(str + ((ulong)(len >> 1) - 2));
    uVar1 = (*(uint *)(str + ((ulong)len - 4)) ^ len ^ uVar3) - (uVar3 << 0xe | uVar3 >> 0x12);
    uVar3 = uVar3 + *(int *)(str + ((ulong)(len >> 2) - 1));
  }
  uVar2 = (uVar2 ^ uVar1) - (uVar1 << 0xb | uVar1 >> 0x15);
  uVar2 = (uVar3 ^ uVar2) - (uVar2 * 0x2000000 | uVar2 >> 7);
  return (uVar1 ^ uVar2) - (uVar2 * 0x10000 | uVar2 >> 0x10);
}

Assistant:

LUA_API uint32_t lua_hash(const char *str, uint32_t len)
{
  uint32_t h = len, a, b;
  if (len >= 4) {
    a = lj_getu32(str);
    h ^= lj_getu32(str+len-4);
    b = lj_getu32(str+(len>>1)-2);
    h ^= b; h -= lj_rol(b, 14);
    b += lj_getu32(str+(len>>2)-1);
  } else if (len > 0) {
    a = *str;
    h ^= *(str+len-1);
    b = *(str+(len>>1));
    h ^= b; h -= lj_rol(b, 14);
  } else {
    return 0;
  }
  a ^= h; a -= lj_rol(h, 11);
  b ^= a; b -= lj_rol(a, 25);
  h ^= b; h -= lj_rol(b, 16);
  return h;
}